

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Status google::protobuf::json_internal::anon_unknown_5::
       ParseAny<google::protobuf::json_internal::ParseProto3Type>
                 (JsonLexer *lex,Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
                 Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  JsonLocation start;
  bool bVar1;
  const_pointer data;
  size_type sVar2;
  ParseOptions *pPVar3;
  MessagePath *path;
  Field pFVar4;
  MaybeOwnedString *pMVar5;
  string *type_url_00;
  LogMessage *pLVar6;
  Msg *in_RCX;
  char *in_R8;
  string_view sVar7;
  anon_class_16_2_ef1c2a00 f;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  LogMessageFatal local_218 [23];
  Voidify local_201;
  JsonLexer *local_200;
  string_view local_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  ZeroCopyBufferedStream *local_1c8;
  size_t sStack_1c0;
  size_t local_1b8;
  size_t sStack_1b0;
  undefined1 local_1a8 [8];
  JsonLexer any_lex;
  ArrayInputStream in;
  undefined1 local_d0 [8];
  string_view any_text;
  undefined1 local_a8 [8];
  optional<google::protobuf::json_internal::MaybeOwnedString> type_url;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  Msg<google::protobuf::json_internal::ParseProto3Type> *msg_local;
  Desc<google::protobuf::json_internal::ParseProto3Type> *desc_local;
  JsonLexer *lex_local;
  Status *_status;
  
  JsonLexer::SkipToToken(lex);
  bVar1 = absl::lts_20240722::Status::ok((Status *)lex);
  mark.loc.path._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
  mark.loc.path._1_3_ = 0;
  if (!mark.loc.path._0_1_) {
    absl::lts_20240722::Status::~Status((Status *)lex);
  }
  if ((uint)mark.loc.path == 0) {
    JsonLexer::BeginMark
              ((LocationWith<google::protobuf::json_internal::Mark> *)
               &type_url.
                super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                ._M_payload.
                super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>.
                _M_engaged,(JsonLexer *)desc);
    std::optional<google::protobuf::json_internal::MaybeOwnedString>::optional
              ((optional<google::protobuf::json_internal::MaybeOwnedString> *)local_a8);
    any_text._M_str = local_a8;
    f.lex = (JsonLexer *)any_text._M_str;
    f.type_url = (optional<google::protobuf::json_internal::MaybeOwnedString> *)desc;
    JsonLexer::
    VisitObject<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>const&)_1_>
              (lex,f);
    bVar1 = absl::lts_20240722::Status::ok((Status *)lex);
    mark.loc.path._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    mark.loc.path._1_3_ = 0;
    if (!mark.loc.path._0_1_) {
      absl::lts_20240722::Status::~Status((Status *)lex);
    }
    if ((uint)mark.loc.path == 0) {
      Mark::UpToUnread((MaybeOwnedString *)&in.position_,
                       (Mark *)&type_url.
                                super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                                .
                                super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                                ._M_engaged,0);
      sVar7 = MaybeOwnedString::operator_cast_to_basic_string_view
                        ((MaybeOwnedString *)&in.position_);
      any_text._M_len = (size_t)sVar7._M_str;
      local_d0 = (undefined1  [8])sVar7._M_len;
      MaybeOwnedString::~MaybeOwnedString((MaybeOwnedString *)&in.position_);
      data = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_d0);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_d0);
      io::ArrayInputStream::ArrayInputStream((ArrayInputStream *)&any_lex.path_,data,(int)sVar2,-1);
      pPVar3 = JsonLexer::options((JsonLexer *)desc);
      path = JsonLexer::path((JsonLexer *)desc);
      local_1b8 = mark.loc.line;
      sStack_1b0 = mark.loc.col;
      local_1c8 = mark.value.guard_.owner_;
      sStack_1c0 = mark.loc.offset;
      start.line = mark.loc.offset;
      start.offset = (size_t)mark.value.guard_.owner_;
      start.col = mark.loc.line;
      start.path = (MessagePath *)mark.loc.col;
      JsonLexer::JsonLexer
                ((JsonLexer *)local_1a8,(ZeroCopyInputStream *)&any_lex.path_,pPVar3,path,start);
      bVar1 = std::optional<google::protobuf::json_internal::MaybeOwnedString>::has_value
                        ((optional<google::protobuf::json_internal::MaybeOwnedString> *)local_a8);
      if ((bVar1) ||
         (pPVar3 = JsonLexer::options((JsonLexer *)desc), (pPVar3->allow_legacy_syntax & 1U) != 0))
      {
        bVar1 = std::optional<google::protobuf::json_internal::MaybeOwnedString>::has_value
                          ((optional<google::protobuf::json_internal::MaybeOwnedString> *)local_a8);
        if (bVar1) {
          JsonLocation::SourceLocation::current();
          pFVar4 = Proto3Type::MustHaveField(msg,1);
          pMVar5 = std::optional<google::protobuf::json_internal::MaybeOwnedString>::operator->
                             ((optional<google::protobuf::json_internal::MaybeOwnedString> *)
                              local_a8);
          local_1f0 = MaybeOwnedString::AsView(pMVar5);
          sVar7._M_str = in_R8;
          sVar7._M_len = (size_t)local_1f0._M_str;
          ParseProto3Type::SetString
                    ((ParseProto3Type *)pFVar4,(Field)in_RCX,(Msg *)local_1f0._M_len,sVar7);
          JsonLocation::SourceLocation::current();
          pFVar4 = Proto3Type::MustHaveField(msg,2);
          pMVar5 = std::optional<google::protobuf::json_internal::MaybeOwnedString>::operator->
                             ((optional<google::protobuf::json_internal::MaybeOwnedString> *)
                              local_a8);
          type_url_00 = MaybeOwnedString::ToString_abi_cxx11_(pMVar5);
          local_200 = (JsonLexer *)local_1a8;
          ParseProto3Type::
          NewDynamic<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)_1_>
                    ((ParseProto3Type *)lex,pFVar4,type_url_00,in_RCX,
                     (anon_class_8_1_5121a82c)local_200);
          mark.loc.path._0_4_ = 1;
        }
        else {
          pPVar3 = JsonLexer::options((JsonLexer *)desc);
          if (((pPVar3->allow_legacy_syntax ^ 0xffU) & 1) != 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_228,"lex.options().allow_legacy_syntax");
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_218,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/parser.cc"
                       ,0x3f7,local_228._M_len,local_228._M_str);
            pLVar6 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                               ((LogMessage *)local_218);
            absl::lts_20240722::log_internal::Voidify::operator&&(&local_201,pLVar6);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_218);
          }
          JsonLexer::
          VisitObject<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(auto:1&)_1_>
                    (lex,(LocationWith<google::protobuf::json_internal::Mark> *)local_1a8);
          bVar1 = absl::lts_20240722::Status::ok((Status *)lex);
          mark.loc.path._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
          mark.loc.path._1_3_ = 0;
          if (!mark.loc.path._0_1_) {
            absl::lts_20240722::Status::~Status((Status *)lex);
          }
          if ((uint)mark.loc.path == 0) {
            absl::lts_20240722::OkStatus();
            mark.loc.path._0_4_ = 1;
          }
        }
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1d8,"missing @type in Any");
        JsonLocation::SourceLocation::current();
        JsonLocation::Invalid
                  ((JsonLocation *)lex,&mark.value.guard_,local_1d8._M_len,local_1d8._M_str);
        mark.loc.path._0_4_ = 1;
      }
      JsonLexer::~JsonLexer((JsonLexer *)local_1a8);
      io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&any_lex.path_);
    }
    std::optional<google::protobuf::json_internal::MaybeOwnedString>::~optional
              ((optional<google::protobuf::json_internal::MaybeOwnedString> *)local_a8);
    LocationWith<google::protobuf::json_internal::Mark>::~LocationWith
              ((LocationWith<google::protobuf::json_internal::Mark> *)
               &type_url.
                super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                ._M_payload.
                super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>.
                _M_engaged);
  }
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status ParseAny(JsonLexer& lex, const Desc<Traits>& desc,
                      Msg<Traits>& msg) {
  // Buffer an entire object. Because @type can occur anywhere, we're forced
  // to do this.
  RETURN_IF_ERROR(lex.SkipToToken());
  auto mark = lex.BeginMark();

  // Search for @type, buffering the entire object along the way so we can
  // reparse it.
  absl::optional<MaybeOwnedString> type_url;
  RETURN_IF_ERROR(lex.VisitObject(
      [&](const LocationWith<MaybeOwnedString>& key) -> absl::Status {
        if (key.value == "@type") {
          if (type_url.has_value()) {
            return key.loc.Invalid("repeated @type in Any");
          }

          absl::StatusOr<LocationWith<MaybeOwnedString>> maybe_url =
              lex.ParseUtf8();
          RETURN_IF_ERROR(maybe_url.status());
          type_url = std::move(maybe_url)->value;
          return absl::OkStatus();
        }
        return lex.SkipValue();
      }));

  // Build a new lexer over the skipped object.
  absl::string_view any_text = mark.value.UpToUnread();
  io::ArrayInputStream in(any_text.data(), any_text.size());
  // Copying lex.options() is important; it inherits the recursion
  // limit.
  JsonLexer any_lex(&in, lex.options(), &lex.path(), mark.loc);

  if (!type_url.has_value() && !lex.options().allow_legacy_syntax) {
    return mark.loc.Invalid("missing @type in Any");
  }

  if (type_url.has_value()) {
    Traits::SetString(Traits::MustHaveField(desc, 1), msg, type_url->AsView());
    return Traits::NewDynamic(
        Traits::MustHaveField(desc, 2), type_url->ToString(), msg,
        [&](const Desc<Traits>& desc, Msg<Traits>& msg) {
          auto pop = any_lex.path().Push("<any>", FieldDescriptor::TYPE_MESSAGE,
                                         Traits::TypeName(desc));
          return ParseMessage<Traits>(any_lex, desc, msg,
                                      /*any_reparse=*/true);
        });
  } else {
    // Empty {} is accepted in legacy mode.
    ABSL_DCHECK(lex.options().allow_legacy_syntax);
    RETURN_IF_ERROR(any_lex.VisitObject([&](auto&) {
      return mark.loc.Invalid(
          "in legacy mode, missing @type in Any is only allowed for an empty "
          "object");
    }));
    return absl::OkStatus();
  }
}